

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser_error parse_lore_blow(parser *p)

{
  long lVar1;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  parser_error pVar5;
  void *pvVar6;
  char *pcVar7;
  blow_method *pbVar8;
  blow_effect *pbVar9;
  long lVar10;
  random_conflict rVar11;
  undefined8 local_38;
  
  pvVar6 = parser_priv(p);
  if (pvVar6 == (void *)0x0) {
    pVar5 = PARSE_ERROR_NONE;
  }
  else {
    pcVar7 = parser_getsym(p,"method");
    pbVar8 = findmeth(pcVar7);
    if (pbVar8 == (blow_method *)0x0) {
      pVar5 = PARSE_ERROR_UNRECOGNISED_BLOW;
    }
    else {
      _Var2 = parser_hasval(p,"effect");
      if (_Var2) {
        pcVar7 = parser_getsym(p,"effect");
        pbVar9 = findeff(pcVar7);
        if (pbVar9 == (blow_effect *)0x0) {
          return PARSE_ERROR_INVALID_EFFECT;
        }
      }
      else {
        pbVar9 = (blow_effect *)0x0;
      }
      _Var2 = parser_hasval(p,"damage");
      wVar3 = L'\0';
      if (_Var2) {
        rVar11 = parser_getrand(p,"damage");
      }
      else {
        rVar11 = (random_conflict)ZEXT816(0);
      }
      local_38 = rVar11._0_8_;
      _Var2 = parser_hasval(p,"seen");
      if (_Var2) {
        wVar3 = parser_getint(p,"seen");
      }
      _Var2 = parser_hasval(p,"index");
      wVar4 = L'\0';
      if (_Var2) {
        wVar4 = parser_getint(p,"index");
      }
      if (wVar4 < (int)(uint)z_info->mon_blows_max) {
        pVar5 = PARSE_ERROR_NONE;
        if (wVar3 != L'\0') {
          lVar1 = *(long *)((long)pvVar6 + 0x18);
          lVar10 = (long)wVar4 * 0x30;
          *(blow_method **)(lVar1 + 8 + lVar10) = pbVar8;
          *(blow_effect **)(lVar1 + 0x10 + lVar10) = pbVar9;
          *(undefined8 *)(lVar1 + 0x18 + lVar10) = local_38;
          *(long *)(lVar1 + 0x20 + lVar10) = rVar11._8_8_;
          *(wchar_t *)(lVar1 + 0x28 + lVar10) = wVar3;
        }
      }
      else {
        pVar5 = PARSE_ERROR_TOO_MANY_ENTRIES;
      }
    }
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_lore_blow(struct parser *p) {
	struct monster_lore *l = parser_priv(p);
	struct blow_method *method = NULL;
	struct blow_effect *effect = NULL;
	int seen = 0, index = 0;
	struct random dam = { 0, 0, 0, 0 };

	if (!l)
		return PARSE_ERROR_NONE;

	/* Read in all the data */
	method = findmeth(parser_getsym(p, "method"));
	if (!method)
		return PARSE_ERROR_UNRECOGNISED_BLOW;
	if (parser_hasval(p, "effect")) {
		effect = findeff(parser_getsym(p, "effect"));
		if (!effect)
			return PARSE_ERROR_INVALID_EFFECT;
	}
	if (parser_hasval(p, "damage"))
		dam = parser_getrand(p, "damage");
	if (parser_hasval(p, "seen"))
		seen = parser_getint(p, "seen");
	if (parser_hasval(p, "index"))
		index = parser_getint(p, "index");
	if (index >= z_info->mon_blows_max)
		return PARSE_ERROR_TOO_MANY_ENTRIES;

	/* Interpret */
	if (seen) {
		struct monster_blow *b = &l->blows[index];
		b->method = method;
		b->effect = effect;
		b->dice = dam;
		b->times_seen = seen;
	}

	return PARSE_ERROR_NONE;
}